

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Stat4ProbeSetValue
              (Parse *pParse,Index *pIdx,UnpackedRecord **ppRec,Expr *pExpr,int nElem,int iVal,
              int *pnExtract)

{
  u8 affinity;
  int iVar1;
  Expr *pExpr_00;
  char *pcVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  ValueNewStat4Ctx alloc;
  sqlite3_value *local_70;
  long local_68;
  long local_60;
  ulong local_58;
  ValueNewStat4Ctx local_50;
  
  if (pExpr != (Expr *)0x0) {
    iVar3 = 0;
    iVar1 = 0;
    if (pExpr->op == 0x83) goto LAB_001884e5;
  }
  if (nElem < 1) {
    iVar3 = 0;
    iVar1 = 0;
  }
  else {
    local_68 = (long)iVal;
    local_60 = (ulong)(uint)nElem - 1;
    local_58 = (ulong)(uint)iVal;
    iVar3 = 0;
    lVar4 = 0;
    local_50.pParse = pParse;
    local_50.pIdx = pIdx;
    local_50.ppRec = ppRec;
    do {
      local_70 = (sqlite3_value *)0x0;
      if (pExpr == (Expr *)0x0) {
        pExpr_00 = (Expr *)0x0;
      }
      else {
        pExpr_00 = sqlite3VectorFieldSubexpr(pExpr,(int)lVar4);
      }
      if ((pIdx->zColAff == (char *)0x0) &&
         (pcVar2 = sqlite3IndexAffinityStr(pParse->db,pIdx), pcVar2 == (char *)0x0)) {
        affinity = 'A';
      }
      else {
        affinity = pIdx->zColAff[lVar4 + local_68];
      }
      local_50.iVal = (int)local_58 + (int)lVar4;
      iVar1 = stat4ValueFromExpr(pParse,pExpr_00,affinity,&local_50,&local_70);
      iVar3 = iVar3 + (uint)(local_70 != (sqlite3_value *)0x0);
    } while ((local_70 != (sqlite3_value *)0x0) &&
            (bVar5 = local_60 != lVar4, lVar4 = lVar4 + 1, bVar5));
  }
LAB_001884e5:
  *pnExtract = iVar3;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Stat4ProbeSetValue(
  Parse *pParse,                  /* Parse context */
  Index *pIdx,                    /* Index being probed */
  UnpackedRecord **ppRec,         /* IN/OUT: Probe record */
  Expr *pExpr,                    /* The expression to extract a value from */
  int nElem,                      /* Maximum number of values to append */
  int iVal,                       /* Array element to populate */
  int *pnExtract                  /* OUT: Values appended to the record */
){
  int rc = SQLITE_OK;
  int nExtract = 0;

  if( pExpr==0 || pExpr->op!=TK_SELECT ){
    int i;
    struct ValueNewStat4Ctx alloc;

    alloc.pParse = pParse;
    alloc.pIdx = pIdx;
    alloc.ppRec = ppRec;

    for(i=0; i<nElem; i++){
      sqlite3_value *pVal = 0;
      Expr *pElem = (pExpr ? sqlite3VectorFieldSubexpr(pExpr, i) : 0);
      u8 aff = sqlite3IndexColumnAffinity(pParse->db, pIdx, iVal+i);
      alloc.iVal = iVal+i;
      rc = stat4ValueFromExpr(pParse, pElem, aff, &alloc, &pVal);
      if( !pVal ) break;
      nExtract++;
    }
  }

  *pnExtract = nExtract;
  return rc;
}